

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O2

TermList Inferences::pushUMinus(UMinus outerMinus,TermList t)

{
  bool bVar1;
  Interpretation IVar2;
  uint uVar3;
  TermList TVar4;
  TermList TVar5;
  UMinus UVar6;
  UMinus outerMinus_local;
  anon_class_8_1_046bb673 wrapMinus;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:860:12),_Kernel::TermList>_>
  local_80;
  MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>
  local_60;
  Stack<Kernel::TermList> local_48;
  
  wrapMinus.outerMinus = &outerMinus_local;
  outerMinus_local = outerMinus;
  if ((t._content & 1) != 0) {
    TVar4 = pushUMinus::anon_class_8_1_046bb673::operator()(&wrapMinus,t);
    return (TermList)TVar4._content;
  }
  if ((*(byte *)(t._content + 0x28) & 0x20) != 0) {
    return (TermList)t._content;
  }
  uVar3 = *(uint *)(t._content + 8);
  bVar1 = Kernel::Theory::isInterpretedFunction((Theory *)Kernel::theory,uVar3);
  if (bVar1) {
    IVar2 = Kernel::Theory::interpretFunction((Theory *)Kernel::theory,uVar3);
    UVar6 = outerMinus_local;
    if (IVar2 == REAL_PLUS) {
      if (outerMinus_local != None) {
        TVar4 = Kernel::Term::termArg(t._content,0);
        TVar4 = pushUMinus(Real,TVar4);
        TVar5 = Kernel::Term::termArg(t._content,1);
        TVar5 = pushUMinus(Real,TVar5);
        TVar4 = Kernel::NumTraits<Kernel::RealConstantType>::add(TVar4,TVar5);
        return (TermList)TVar4._content;
      }
    }
    else {
      if (IVar2 != INT_PLUS) {
        if (IVar2 == RAT_UNARY_MINUS) {
          TVar4 = Kernel::Term::termArg(t._content,0);
          if (UVar6 != None) {
            return (TermList)TVar4._content;
          }
          UVar6 = Rat;
        }
        else {
          if (IVar2 == RAT_PLUS) {
            if (outerMinus_local != None) {
              TVar4 = Kernel::Term::termArg(t._content,0);
              TVar4 = pushUMinus(Rat,TVar4);
              TVar5 = Kernel::Term::termArg(t._content,1);
              TVar5 = pushUMinus(Rat,TVar5);
              TVar4 = Kernel::NumTraits<Kernel::RationalConstantType>::add(TVar4,TVar5);
              return (TermList)TVar4._content;
            }
            goto LAB_00415c30;
          }
          if (IVar2 == REAL_UNARY_MINUS) {
            TVar4 = Kernel::Term::termArg(t._content,0);
            if (UVar6 != None) {
              return (TermList)TVar4._content;
            }
            UVar6 = Real;
          }
          else {
            if (IVar2 != INT_UNARY_MINUS) goto LAB_00415c30;
            TVar4 = Kernel::Term::termArg(t._content,0);
            if (UVar6 != None) {
              return (TermList)TVar4._content;
            }
            UVar6 = Int;
          }
        }
        TVar4 = pushUMinus(UVar6,TVar4);
        return (TermList)TVar4._content;
      }
      if (outerMinus_local != None) {
        TVar4 = Kernel::Term::termArg(t._content,0);
        TVar4 = pushUMinus(Int,TVar4);
        TVar5 = Kernel::Term::termArg(t._content,1);
        TVar5 = pushUMinus(Int,TVar5);
        TVar4 = Kernel::NumTraits<Kernel::IntegerConstantType>::add(TVar4,TVar5);
        return (TermList)TVar4._content;
      }
    }
  }
LAB_00415c30:
  uVar3 = Kernel::Term::numTypeArguments((Term *)t._content);
  local_60._inner._to = Kernel::Term::numTermArguments((Term *)t._content);
  bVar1 = true;
  local_80._iter._inner._next = 0;
  local_80._iter._inner._from = 0;
  local_60._inner._next = 0;
  local_60._inner._from = 0;
  local_48._capacity = 0;
  local_48._stack = (TermList *)0x0;
  local_48._cursor = (TermList *)0x0;
  local_48._end = (TermList *)0x0;
  local_80._iter._func.term = (Term *)t._content;
  local_80._iter._inner._to = uVar3;
  local_60._func.term = (Term *)t._content;
  do {
    if (bVar1) {
      if (local_80._iter._inner._to <= local_80._iter._inner._next) {
        bVar1 = false;
        goto LAB_00415c99;
      }
    }
    else {
LAB_00415c99:
      if (local_60._inner._to <= local_60._inner._next) {
        TVar4._content = (uint64_t)Kernel::Term::create(t._content,local_48._stack);
        TVar4 = pushUMinus::anon_class_8_1_046bb673::operator()(&wrapMinus,TVar4);
        Lib::Stack<Kernel::TermList>::~Stack(&local_48);
        return (TermList)TVar4._content;
      }
    }
    if ((bVar1) && (local_80._iter._inner._to <= local_80._iter._inner._next)) {
      bVar1 = false;
    }
    if (bVar1) {
      TVar4._content =
           (uint64_t)
           Lib::
           IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:860:12),_Kernel::TermList>_>
           ::next(&local_80);
    }
    else {
      TVar4 = Lib::
              MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:848:12),_Kernel::TermList>
              ::next(&local_60);
      TVar4 = pushUMinus(None,TVar4);
    }
    Lib::Stack<Kernel::TermList>::push(&local_48,TVar4);
  } while( true );
}

Assistant:

TermList pushUMinus(UMinus outerMinus, TermList t) 
{
  auto wrapMinus = [&](TermList t) 
  {
    switch (outerMinus) {
      case UMinus::Int : return IntTraits::minus(t);
      case UMinus::Rat : return RatTraits::minus(t);
      case UMinus::Real: return RealTraits::minus(t);
      case UMinus::None: return t;
      default:
        ASSERTION_VIOLATION;
    }
    ASSERTION_VIOLATION
  };

  if (t.isVar()) {
    return wrapMinus(t);
  } else if(t.term()->isSort()){
    return t;
  } else {
    auto term = t.term();
auto fun = term->functor();
    if (theory->isInterpretedFunction(fun)) {
      switch (theory->interpretFunction(fun)) {
#define CASE(Num)                                                                                             \
        case Num##Traits::minusI:                                                                             \
        {                                                                                                     \
          if(outerMinus == UMinus::None) {                                                                    \
            return pushUMinus(UMinus::Num, term->termArg(0));                                                 \
          } else {                                                                                            \
            ASS_EQ(outerMinus, UMinus::Num)                                                                   \
            return term->termArg(0);                                                                          \
          }                                                                                                   \
        }                                                                                                     \
        case Num##Traits::addI:                                                                               \
        if (outerMinus != UMinus::None) {                                                                     \
          ASS_EQ(outerMinus, UMinus::Num);                                                                    \
          return Num##Traits::add(                                                                            \
              pushUMinus(UMinus::Num, term->termArg(0)),                                                      \
              pushUMinus(UMinus::Num, term->termArg(1)));                                                     \
        } else { break; }
        CASE(Int)
        CASE(Rat)
        CASE(Real)
        default: {}
      }
    }
    auto args = concatIters(
        typeArgIter(term),
        termArgIter(term)
          .map([&](auto t) { return pushUMinus(UMinus::None, t); }))
      .template collect<Stack>();

    return wrapMinus(TermList(Term::create(term, args.begin())));
  }
}
PushUnaryMinus::~PushUnaryMinus() {}

Clause* PushUnaryMinus::simplify(Clause* cl_) 
{
  DEBUG("in:  ", *cl_)
  if (cl_->isTheoryAxiom()) 
    return cl_;

  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;

  for (unsigned i = 0; i < cl.size(); i++) {
    auto litIn = cl[i];
    auto litStack = concatIters(
        typeArgIter(litIn),
        termArgIter(litIn)
          .map([&](auto tIn) {
            auto tOut = pushUMinus(UMinus::None, tIn);
            changed = changed || tIn != tOut;
            return tOut;
          })
        ).template collect<Stack>();
    if(changed){
      auto litOut = Literal::create(litIn, litStack.begin());
      out.push(litOut);
    } else {
      out.push(litIn);
    }
  }

  if (!changed) {
    return cl_;
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(InferenceRule::EVALUATION, cl_));
    DEBUG("out: ", *result)
    return result;
  }
}


}